

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tiskin.cpp
# Opt level: O3

void setupBsp(BSP<int> *tAlg,uint n,uint p,int seed,IntVector *input,
             vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
             *bspInputs,
             vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
             *bspOutputs)

{
  pointer piVar1;
  pointer pvVar2;
  void *pvVar3;
  long lVar4;
  BSP<int> *this;
  Superstep<int> *pSVar5;
  ulong uVar6;
  vector<std::shared_ptr<Superstep<int>_>,_std::allocator<std::shared_ptr<Superstep<int>_>_>_>
  *this_00;
  uint uVar7;
  ulong uVar9;
  uint uVar10;
  SuperstepPointer s0;
  SuperstepPointer s2;
  SuperstepPointer s1;
  UTimer superstepCreator;
  random_device randomDevice;
  vector<int,_std::allocator<int>_> local_15b8;
  Superstep<int> *local_1598;
  __shared_count<(__gnu_cxx::_Lock_policy)2> a_Stack_1590 [2];
  BSP<int> *local_1580;
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  local_1578;
  UTimer local_1558;
  _Any_data local_1518;
  code *local_1508;
  code *local_1500;
  _Any_data local_14f8;
  code *local_14e8;
  code *local_14e0;
  _Any_data local_14d8;
  code *local_14c8;
  code *local_14c0;
  IntVector *local_14b0;
  _Any_data local_14a8;
  code *local_1498;
  code *local_1490;
  _Any_data local_1488;
  code *local_1478;
  code *local_1470;
  _Any_data local_1468;
  code *local_1458;
  code *local_1450;
  shared_ptr<Superstep<int>_> local_1448;
  shared_ptr<Superstep<int>_> local_1438;
  shared_ptr<Superstep<int>_> local_1428;
  string local_1418;
  string local_13f8;
  string local_13d8;
  random_device local_13b8;
  ulong uVar8;
  ulong uVar11;
  
  std::random_device::random_device(&local_13b8);
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)&local_1558,(ulong)n,(allocator_type *)&local_15b8
            );
  piVar1 = (input->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
           _M_start;
  (input->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data._M_start =
       (pointer)local_1558.start.__d.__r;
  (input->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data._M_finish =
       (pointer)local_1558.stop.__d.__r;
  (input->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)local_1558.elapsedTime.__r;
  local_1558.start.__d.__r = (duration)0;
  local_1558.stop.__d.__r = (duration)0;
  local_1558.elapsedTime.__r = 0.0;
  if (piVar1 != (pointer)0x0) {
    operator_delete(piVar1);
    if (local_1558.start.__d.__r != 0) {
      operator_delete((void *)local_1558.start.__d.__r);
    }
  }
  local_13d8._M_dataplus._M_p = (pointer)&local_13d8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_13d8,"Creating random vector","")
  ;
  UTimer::UTimer(&local_1558,&local_13d8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_13d8._M_dataplus._M_p != &local_13d8.field_2) {
    operator_delete(local_13d8._M_dataplus._M_p);
  }
  if (seed == -1) {
    seed = std::random_device::_M_getval();
  }
  createRandomVector(input,seed);
  UTimer::~UTimer(&local_1558);
  local_13f8._M_dataplus._M_p = (pointer)&local_13f8.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_13f8,"Creating BSP input vectors","");
  UTimer::UTimer(&local_1558,&local_13f8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_13f8._M_dataplus._M_p != &local_13f8.field_2) {
    operator_delete(local_13f8._M_dataplus._M_p);
  }
  std::
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ::vector(&local_1578,(ulong)p,(allocator_type *)&local_1598);
  local_15b8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage =
       (pointer)(bspInputs->
                super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                )._M_impl.super__Vector_impl_data._M_end_of_storage;
  (bspInputs->
  super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  )._M_impl.super__Vector_impl_data._M_end_of_storage =
       local_1578.
       super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
       ._M_impl.super__Vector_impl_data._M_end_of_storage;
  local_15b8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start
       = (pointer)(bspInputs->
                  super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                  )._M_impl.super__Vector_impl_data._M_start;
  local_15b8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish
       = (pointer)(bspInputs->
                  super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                  )._M_impl.super__Vector_impl_data._M_finish;
  (bspInputs->
  super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  )._M_impl.super__Vector_impl_data._M_start =
       local_1578.
       super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
       ._M_impl.super__Vector_impl_data._M_start;
  (bspInputs->
  super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  )._M_impl.super__Vector_impl_data._M_finish =
       local_1578.
       super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  local_1578.
  super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_1578.
  super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_1578.
  super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_1580 = tAlg;
  local_14b0 = input;
  std::
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ::~vector((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
             *)&local_15b8);
  std::
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ::~vector(&local_1578);
  std::
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ::vector(&local_1578,(ulong)p,(allocator_type *)&local_1598);
  local_15b8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage =
       (pointer)(bspOutputs->
                super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                )._M_impl.super__Vector_impl_data._M_end_of_storage;
  (bspOutputs->
  super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  )._M_impl.super__Vector_impl_data._M_end_of_storage =
       local_1578.
       super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
       ._M_impl.super__Vector_impl_data._M_end_of_storage;
  local_15b8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start
       = (pointer)(bspOutputs->
                  super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                  )._M_impl.super__Vector_impl_data._M_start;
  local_15b8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish
       = (pointer)(bspOutputs->
                  super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                  )._M_impl.super__Vector_impl_data._M_finish;
  (bspOutputs->
  super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  )._M_impl.super__Vector_impl_data._M_start =
       local_1578.
       super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
       ._M_impl.super__Vector_impl_data._M_start;
  (bspOutputs->
  super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  )._M_impl.super__Vector_impl_data._M_finish =
       local_1578.
       super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  local_1578.
  super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_1578.
  super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_1578.
  super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ::~vector((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
             *)&local_15b8);
  std::
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ::~vector(&local_1578);
  uVar6 = 0;
  uVar8 = (ulong)n / (ulong)p;
  uVar10 = p + (p == 0);
  uVar11 = (ulong)uVar10;
  do {
    std::vector<int,_std::allocator<int>_>::vector(&local_15b8,uVar8,(allocator_type *)&local_1578);
    pvVar2 = (bspInputs->
             super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
             )._M_impl.super__Vector_impl_data._M_start;
    pvVar3 = pvVar2[uVar6].super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
    pvVar2[uVar6].super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_start = local_15b8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start;
    *(pointer *)
     ((long)&pvVar2[uVar6].super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data + 8) =
         local_15b8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
         _M_finish;
    *(pointer *)
     ((long)&pvVar2[uVar6].super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data + 0x10) =
         local_15b8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
         _M_end_of_storage;
    local_15b8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_start = (pointer)0x0;
    local_15b8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_finish = (pointer)0x0;
    local_15b8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)0x0;
    if (pvVar3 != (void *)0x0) {
      operator_delete(pvVar3);
      if ((pointer)local_15b8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_15b8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_start);
      }
    }
    if (p <= n) {
      piVar1 = (local_14b0->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
               super__Vector_impl_data._M_start;
      lVar4 = *(long *)&(bspInputs->
                        super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                        )._M_impl.super__Vector_impl_data._M_start[uVar6].
                        super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data;
      uVar9 = 0;
      do {
        *(int *)(lVar4 + uVar9 * 4) = piVar1[(uint)((int)uVar6 * (int)uVar8 + (int)uVar9)];
        uVar9 = uVar9 + 1;
      } while (uVar9 < uVar8);
    }
    uVar6 = uVar6 + 1;
  } while (uVar6 != uVar11);
  UTimer::~UTimer(&local_1558);
  local_1418._M_dataplus._M_p = (pointer)&local_1418.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_1418,"Creating supersteps","");
  UTimer::UTimer(&local_1558,&local_1418);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1418._M_dataplus._M_p != &local_1418.field_2) {
    operator_delete(local_1418._M_dataplus._M_p);
  }
  pSVar5 = (Superstep<int> *)operator_new(0x188);
  Superstep<int>::Superstep(pSVar5);
  local_15b8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start
       = (pointer)pSVar5;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::__shared_count<Superstep<int>*>
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
             &local_15b8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_finish,pSVar5);
  uVar8 = uVar11;
  do {
    local_1468._M_unused._M_object = (void *)0x0;
    local_1468._8_8_ = 0;
    local_1450 = std::
                 _Function_handler<void_(int,_std::vector<int,_std::allocator<int>_>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/dima91[P]BSP-pattern/src/tiskin.cpp:189:4)>
                 ::_M_invoke;
    local_1458 = std::
                 _Function_handler<void_(int,_std::vector<int,_std::allocator<int>_>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/dima91[P]BSP-pattern/src/tiskin.cpp:189:4)>
                 ::_M_manager;
    local_14d8._8_8_ = 0;
    local_14d8._4_4_ = 0;
    local_14d8._0_4_ = p;
    local_14c0 = std::
                 _Function_handler<std::vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>_(int,_std::vector<int,_std::allocator<int>_>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/dima91[P]BSP-pattern/src/tiskin.cpp:196:4)>
                 ::_M_invoke;
    local_14c8 = std::
                 _Function_handler<std::vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>_(int,_std::vector<int,_std::allocator<int>_>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/dima91[P]BSP-pattern/src/tiskin.cpp:196:4)>
                 ::_M_manager;
    Superstep<int>::addActivity
              ((Superstep<int> *)
               local_15b8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start,(ActivityFunction *)&local_1468,
               (function<std::vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>_(int,_std::vector<int,_std::allocator<int>_>_&)>
                *)&local_14d8);
    if (local_14c8 != (code *)0x0) {
      (*local_14c8)(&local_14d8,&local_14d8,__destroy_functor);
    }
    if (local_1458 != (code *)0x0) {
      (*local_1458)(&local_1468,&local_1468,__destroy_functor);
    }
    uVar7 = (int)uVar8 - 1;
    uVar8 = (ulong)uVar7;
  } while (uVar7 != 0);
  local_1428.super___shared_ptr<Superstep<int>,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)
       local_15b8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
       _M_start;
  local_1428.super___shared_ptr<Superstep<int>,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
       local_15b8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
       _M_finish;
  local_15b8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start
       = (pointer)0x0;
  local_15b8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish
       = (pointer)0x0;
  this_00 = &local_1580->supersteps;
  std::vector<std::shared_ptr<Superstep<int>>,std::allocator<std::shared_ptr<Superstep<int>>>>::
  emplace_back<std::shared_ptr<Superstep<int>>&>
            ((vector<std::shared_ptr<Superstep<int>>,std::allocator<std::shared_ptr<Superstep<int>>>>
              *)this_00,&local_1428);
  if (local_1428.super___shared_ptr<Superstep<int>,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_1428.super___shared_ptr<Superstep<int>,_(__gnu_cxx::_Lock_policy)2>._M_refcount
               ._M_pi);
  }
  local_1580 = (BSP<int> *)this_00;
  pSVar5 = (Superstep<int> *)operator_new(0x188);
  Superstep<int>::Superstep(pSVar5);
  local_1578.
  super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)pSVar5;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::__shared_count<Superstep<int>*>
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
             &local_1578.
              super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish,pSVar5);
  do {
    local_1488._M_unused._M_object = (void *)0x0;
    local_1488._8_8_ = 0;
    local_1470 = std::
                 _Function_handler<void_(int,_std::vector<int,_std::allocator<int>_>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/dima91[P]BSP-pattern/src/tiskin.cpp:220:4)>
                 ::_M_invoke;
    local_1478 = std::
                 _Function_handler<void_(int,_std::vector<int,_std::allocator<int>_>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/dima91[P]BSP-pattern/src/tiskin.cpp:220:4)>
                 ::_M_manager;
    local_14f8._8_8_ = 0;
    local_14f8._4_4_ = 0;
    local_14f8._0_4_ = p;
    local_14e0 = std::
                 _Function_handler<std::vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>_(int,_std::vector<int,_std::allocator<int>_>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/dima91[P]BSP-pattern/src/tiskin.cpp:224:5)>
                 ::_M_invoke;
    local_14e8 = std::
                 _Function_handler<std::vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>_(int,_std::vector<int,_std::allocator<int>_>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/dima91[P]BSP-pattern/src/tiskin.cpp:224:5)>
                 ::_M_manager;
    Superstep<int>::addActivity
              ((Superstep<int> *)
               local_1578.
               super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start,(ActivityFunction *)&local_1488,
               (function<std::vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>_(int,_std::vector<int,_std::allocator<int>_>_&)>
                *)&local_14f8);
    if (local_14e8 != (code *)0x0) {
      (*local_14e8)(&local_14f8,&local_14f8,__destroy_functor);
    }
    if (local_1478 != (code *)0x0) {
      (*local_1478)(&local_1488,&local_1488,__destroy_functor);
    }
    this = local_1580;
    uVar10 = uVar10 - 1;
  } while (uVar10 != 0);
  local_1438.super___shared_ptr<Superstep<int>,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)
       local_1578.
       super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
       ._M_impl.super__Vector_impl_data._M_start;
  local_1438.super___shared_ptr<Superstep<int>,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
       local_1578.
       super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  local_1578.
  super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_1578.
  super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  std::vector<std::shared_ptr<Superstep<int>>,std::allocator<std::shared_ptr<Superstep<int>>>>::
  emplace_back<std::shared_ptr<Superstep<int>>&>
            ((vector<std::shared_ptr<Superstep<int>>,std::allocator<std::shared_ptr<Superstep<int>>>>
              *)local_1580,&local_1438);
  if (local_1438.super___shared_ptr<Superstep<int>,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_1438.super___shared_ptr<Superstep<int>,_(__gnu_cxx::_Lock_policy)2>._M_refcount
               ._M_pi);
  }
  pSVar5 = (Superstep<int> *)operator_new(0x188);
  Superstep<int>::Superstep(pSVar5);
  local_1598 = pSVar5;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::__shared_count<Superstep<int>*>
            (a_Stack_1590,pSVar5);
  do {
    local_14a8._M_unused._M_object = (void *)0x0;
    local_14a8._8_8_ = 0;
    local_1490 = std::
                 _Function_handler<void_(int,_std::vector<int,_std::allocator<int>_>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/dima91[P]BSP-pattern/src/tiskin.cpp:262:4)>
                 ::_M_invoke;
    local_1498 = std::
                 _Function_handler<void_(int,_std::vector<int,_std::allocator<int>_>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/dima91[P]BSP-pattern/src/tiskin.cpp:262:4)>
                 ::_M_manager;
    local_1518._8_8_ = 0;
    local_1518._4_4_ = 0;
    local_1518._0_4_ = p;
    local_1500 = std::
                 _Function_handler<std::vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>_(int,_std::vector<int,_std::allocator<int>_>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/dima91[P]BSP-pattern/src/tiskin.cpp:266:5)>
                 ::_M_invoke;
    local_1508 = std::
                 _Function_handler<std::vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>_(int,_std::vector<int,_std::allocator<int>_>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/dima91[P]BSP-pattern/src/tiskin.cpp:266:5)>
                 ::_M_manager;
    Superstep<int>::addActivity
              (local_1598,(ActivityFunction *)&local_14a8,
               (function<std::vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>_(int,_std::vector<int,_std::allocator<int>_>_&)>
                *)&local_1518);
    if (local_1508 != (code *)0x0) {
      (*local_1508)(&local_1518,&local_1518,__destroy_functor);
    }
    if (local_1498 != (code *)0x0) {
      (*local_1498)(&local_14a8,&local_14a8,__destroy_functor);
    }
    uVar10 = (int)uVar11 - 1;
    uVar11 = (ulong)uVar10;
  } while (uVar10 != 0);
  local_1448.super___shared_ptr<Superstep<int>,_(__gnu_cxx::_Lock_policy)2>._M_ptr = local_1598;
  local_1448.super___shared_ptr<Superstep<int>,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       a_Stack_1590[0]._M_pi;
  local_1598 = (Superstep<int> *)0x0;
  a_Stack_1590[0]._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  std::vector<std::shared_ptr<Superstep<int>>,std::allocator<std::shared_ptr<Superstep<int>>>>::
  emplace_back<std::shared_ptr<Superstep<int>>&>
            ((vector<std::shared_ptr<Superstep<int>>,std::allocator<std::shared_ptr<Superstep<int>>>>
              *)this,&local_1448);
  if (local_1448.super___shared_ptr<Superstep<int>,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_1448.super___shared_ptr<Superstep<int>,_(__gnu_cxx::_Lock_policy)2>._M_refcount
               ._M_pi);
  }
  if (a_Stack_1590[0]._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(a_Stack_1590[0]._M_pi);
  }
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
      local_1578.
      super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
               local_1578.
               super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish);
  }
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
      local_15b8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_finish != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
               local_15b8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_finish);
  }
  UTimer::~UTimer(&local_1558);
  std::random_device::_M_fini();
  return;
}

Assistant:

void setupBsp (BSP<int> &tAlg, uint n, uint p, int seed, IntVector &input,
				std::vector<IntVector> &bspInputs, std::vector<IntVector> &bspOutputs) {
	
	std::random_device randomDevice;
	input	= IntVector	(n);
	
	{
		UTimer randomVector ("Creating random vector");
		createRandomVector (input, (seed==-1) ? randomDevice() : seed);
	}


	{
		UTimer bspInputVectors ("Creating BSP input vectors");
		
		bspInputs	= std::vector<IntVector> (p);
		bspOutputs	= std::vector<IntVector> (p);

		uint actInputLen	= n/p;
		for (uint i=0; i<p; i++) {
			bspInputs[i]	= IntVector (actInputLen);
			auto &vI		= bspInputs[i];
			for (uint j=0; j<actInputLen; j++) {
				vI[j]	= input[(actInputLen*i)+j];
			}
		}
	}


	UTimer superstepCreator ("Creating supersteps");


	// ============================================================
	// ============================================================
	// Superstep 0

	BSP<int>::SuperstepPointer s0	= BSP<int>::SuperstepPointer (new Superstep<int> ());

	for (uint i= 0; i<p; i++) {
		s0->addActivity (
			[] (uint activityIndex, IntVector &actInput) {
				TISKIN_PRINT_V ("Input vector of activity " << activityIndex << ": ", actInput, "");
				std::sort (actInput.begin(), actInput.end());
				mapMutex.lock ();
				s0VectorsMap[activityIndex]	= actInput;
				mapMutex.unlock ();
			},
			[p] (uint activityIndex, IntVector &elements) {
				IntCommunicationProtocols cp (p);
				cp[0]	= IntVector (p+1);
				findOutSeparators (std::ref(cp[0]), std::ref(elements), p+1);
				for (uint i=1; i<p; i++) {
					cp[i]	= IntVector (p+1);
					cp[i]	= cp[0];
				}
				return cp;
			}
		);
	}

	tAlg.addSuperstep (std::move(s0));


	// ============================================================
	// ============================================================
	// Superstep 1 

	BSP<int>::SuperstepPointer s1	= BSP<int>::SuperstepPointer (new Superstep<int> ());

	for (uint i= 0; i<p; i++) {
		s1->addActivity (
			[] (uint activityIndex, IntVector &actInput) {
				TISKIN_PRINT_V ("Input vector of activity " << activityIndex << ": ", actInput, "");
				std::sort (actInput.begin(), actInput.end());
			},
			([p] (uint activityIndex, IntVector &commElements) {
				std::vector<IntVector> cp (p);
				IntVector separators (p+1);
				findOutSeparators (std::ref(separators), std::ref(commElements), p+1);
				
				mapMutex.lock ();
				IntVector &pi	= s0VectorsMap[activityIndex];
				mapMutex.unlock ();
				size_t i				= 0;	// Index for 'pi' vector
				size_t j				= 1;	// Index for 'separators' vector
				size_t k				= 0;	// Index for 'cp' vector

				while (i < pi.size()) {
					cp[k]	= IntVector ();
					while (i < pi.size() && pi[i] <= separators[j]) {
						cp[k].emplace_back (pi[i]);
						i++;
					}
					j++;
					k++;
				}

				return cp;
			})
		);
	}

	tAlg.addSuperstep (std::move(s1));


	// ============================================================
	// ============================================================
	// Superstep 2

	BSP<int>::SuperstepPointer s2	= BSP<int>::SuperstepPointer (new Superstep<int> ());

	for (uint i= 0; i<p; i++) {
		s2->addActivity (
			[] (uint activityIndex, IntVector &actInput) {
				TISKIN_PRINT_V ("Input vector of activity " << activityIndex << ": ", actInput, "");
				std::sort (actInput.begin(), actInput.end());
			},
			([p] (uint activityIndex, IntVector &elements) {
				std::vector<IntVector> cp (p);
				for (auto el: elements) {
					cp[activityIndex].emplace_back (el);
				}
				return cp;
			})
		);
	}

	tAlg.addSuperstep (std::move(s2));
}